

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

void __thiscall BRTS_XZ<RemSP>::PerformLabelingWithSteps(BRTS_XZ<RemSP> *this)

{
  PerformanceEvaluator *this_00;
  string sStack_48;
  double local_28;
  double local_20;
  
  local_20 = Alloc(this);
  InitCompressedData(this,&this->data_compressed);
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(this_00);
  FirstScan(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&sStack_48,FIRST_SCAN);
  PerformanceEvaluator::store
            (this_00,&sStack_48,
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&sStack_48);
  PerformanceEvaluator::start(this_00);
  SecondScan(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&sStack_48,SECOND_SCAN);
  PerformanceEvaluator::store
            (this_00,&sStack_48,
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&sStack_48);
  local_28 = Get_RunAllocTime(this);
  PerformanceEvaluator::start(this_00);
  Dealloc(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&sStack_48,ALLOC_DEALLOC);
  PerformanceEvaluator::store
            (this_00,&sStack_48,
             local_20 +
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
             + local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void PerformLabelingWithSteps() {
        double alloc_timing = Alloc();
        InitCompressedData(data_compressed);

        perf_.start();
        FirstScan();
        perf_.stop();
        perf_.store(Step(StepType::FIRST_SCAN), perf_.last());

        perf_.start();
        SecondScan();
        perf_.stop();
        perf_.store(Step(StepType::SECOND_SCAN), perf_.last());

        double t_runalloc = Get_RunAllocTime();
        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing + t_runalloc);
    }